

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmp4stream.cpp
# Opt level: O0

void __thiscall fmp4_stream::tfdt::parse(tfdt *this,char *ptr)

{
  uint32_t uVar1;
  uint64_t local_28;
  char *ptr_local;
  tfdt *this_local;
  
  full_box::parse(&this->super_full_box,ptr);
  if ((this->super_full_box).super_box.field_0x62 == '\0') {
    uVar1 = anon_unknown.dwarf_2d683::fmp4_read_uint32(ptr + 0xc);
    local_28 = (uint64_t)uVar1;
  }
  else {
    local_28 = anon_unknown.dwarf_2d683::fmp4_read_uint64(ptr + 0xc);
  }
  this->base_media_decode_time_ = local_28;
  return;
}

Assistant:

void tfdt::parse(const char* ptr)
	{
		full_box::parse(ptr);
		base_media_decode_time_ = version_ ? \
			fmp4_read_uint64((char *)(ptr + 12)) : \
			fmp4_read_uint32((char *)(ptr + 12));

	}